

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseEnumConstantOptions
          (Parser *this,EnumValueDescriptorProto *value,LocationRecorder *enum_value_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  EnumValueOptions *options;
  string_view local_98;
  string_view local_88;
  undefined4 local_78;
  string_view local_68;
  undefined1 local_58 [8];
  LocationRecorder location;
  FileDescriptorProto *containing_file_local;
  LocationRecorder *enum_value_location_local;
  EnumValueDescriptorProto *value_local;
  Parser *this_local;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&location.location_,"[");
  bVar1 = LookingAt(this,stack0xffffffffffffffc0);
  if (bVar1) {
    LocationRecorder::LocationRecorder((LocationRecorder *)local_58,enum_value_location,3);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68,"[");
    bVar1 = Consume(this,local_68);
    if (bVar1) {
      do {
        options = EnumValueDescriptorProto::mutable_options(value);
        bVar1 = ParseOption(this,&options->super_Message,(LocationRecorder *)local_58,
                            containing_file,OPTION_ASSIGNMENT);
        if (!bVar1) {
          this_local._7_1_ = false;
          goto LAB_002c0eee;
        }
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_88,",");
        bVar1 = TryConsume(this,local_88);
      } while (bVar1);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_98,"]");
      bVar1 = Consume(this,local_98);
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
LAB_002c0eee:
    local_78 = 1;
    LocationRecorder::~LocationRecorder((LocationRecorder *)local_58);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Parser::ParseEnumConstantOptions(
    EnumValueDescriptorProto* value,
    const LocationRecorder& enum_value_location,
    const FileDescriptorProto* containing_file) {
  if (!LookingAt("[")) return true;

  LocationRecorder location(enum_value_location,
                            EnumValueDescriptorProto::kOptionsFieldNumber);

  DO(Consume("["));

  do {
    DO(ParseOption(value->mutable_options(), location, containing_file,
                   OPTION_ASSIGNMENT));
  } while (TryConsume(","));

  DO(Consume("]"));
  return true;
}